

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cc
# Opt level: O2

bool __thiscall
google::protobuf::json_internal::JsonWriter::MaybeWriteSpecialFp(JsonWriter *this,double val)

{
  char *bytes;
  size_t sStack_10;
  
  if (val < INFINITY) {
    if (-INFINITY < val) {
      if (!NAN(val)) {
        return false;
      }
      bytes = "\"NaN\"";
      sStack_10 = 5;
    }
    else {
      bytes = "\"-Infinity\"";
      sStack_10 = 0xb;
    }
  }
  else {
    bytes = "\"Infinity\"";
    sStack_10 = 10;
  }
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,bytes,sStack_10);
  return true;
}

Assistant:

bool JsonWriter::MaybeWriteSpecialFp(double val) {
  if (val == std::numeric_limits<double>::infinity()) {
    Write("\"Infinity\"");
  } else if (val == -std::numeric_limits<double>::infinity()) {
    Write("\"-Infinity\"");
  } else if (std::isnan(val)) {
    Write("\"NaN\"");
  } else {
    return false;
  }
  return true;
}